

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

uint64_t helper_unpack(target_ulong_conflict arg1)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = arg1 >> 0x17 & 0xff;
  uVar3 = arg1 & 0x7fffff;
  if (uVar1 == 0xff) {
    uVar4 = uVar3 << 7;
    uVar2 = 0xff00000000;
  }
  else if (uVar1 == 0 && uVar3 == 0) {
    uVar4 = 0;
    uVar2 = 0xffffff8100000000;
  }
  else {
    uVar4 = uVar3 << 7;
    if (uVar3 == 0 || uVar1 != 0) {
      uVar4 = uVar4 | 0x40000000;
      uVar2 = ((ulong)uVar1 << 0x20) - 0x7f00000000;
    }
    else {
      uVar2 = 0xffffff8200000000;
    }
  }
  return uVar4 | uVar2;
}

Assistant:

static inline uint32_t extract32(uint32_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 32 - start);
    return (value >> start) & (~0U >> (32 - length));
}